

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbaselib.cpp
# Opt level: O3

SQInteger base_compilestring(HSQUIRRELVM v)

{
  SQInteger SVar1;
  SQInteger size;
  SQRESULT SVar2;
  char *sourcename;
  SQChar *name;
  SQChar *src;
  char *local_30;
  SQChar *local_28;
  
  SVar1 = sq_gettop(v);
  local_28 = (SQChar *)0x0;
  local_30 = "unnamedbuffer";
  sq_getstring(v,2,&local_28);
  size = sq_getsize(v,2);
  sourcename = "unnamedbuffer";
  if (2 < SVar1) {
    sq_getstring(v,3,&local_30);
    sourcename = local_30;
  }
  SVar2 = sq_compilebuffer(v,local_28,size,sourcename,0);
  return SVar2 >> 0x3f | 1;
}

Assistant:

static SQInteger base_compilestring(HSQUIRRELVM v)
{
    SQInteger nargs=sq_gettop(v);
    const SQChar *src=NULL,*name=_SC("unnamedbuffer");
    SQInteger size;
    sq_getstring(v,2,&src);
    size=sq_getsize(v,2);
    if(nargs>2){
        sq_getstring(v,3,&name);
    }
    if(SQ_SUCCEEDED(sq_compilebuffer(v,src,size,name,SQFalse)))
        return 1;
    else
        return SQ_ERROR;
}